

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidUpsampleAlignCorners(void)

{
  RepeatedField<long> *this;
  int iVar1;
  PoolingLayerParams *pPVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  UpsampleLayerParams *this_02;
  Model *pMVar8;
  ostream *poVar9;
  int iVar10;
  uint uVar11;
  Result res;
  Model m1;
  Model mlmodel;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  Model local_70;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  CoreML::Specification::Model::Model(&local_70);
  if (local_70.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_70.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_70.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_98 = (undefined1  [8])local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_98);
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98,local_88._0_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  pAVar7 = (pFVar6->Type_).multiarraytype_;
  this = &pAVar7->shape_;
  iVar1 = (pAVar7->shape_).total_size_;
  if ((pAVar7->shape_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar1 + 1);
  }
  iVar1 = (pAVar7->shape_).current_size_;
  iVar10 = iVar1 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar1] = 5;
  iVar1 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar1 + 1);
  }
  iVar1 = (pAVar7->shape_).current_size_;
  iVar10 = iVar1 + 1;
  (pAVar7->shape_).current_size_ = iVar10;
  ((pAVar7->shape_).rep_)->elements[iVar1] = 5;
  iVar1 = (pAVar7->shape_).total_size_;
  if (iVar10 == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar1 + 1);
  }
  iVar1 = (pAVar7->shape_).current_size_;
  (pAVar7->shape_).current_size_ = iVar1 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar1] = 5;
  if (local_70.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_70.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_70.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_98 = (undefined1  [8])local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_98);
  if (local_98 != (undefined1  [8])local_88) {
    operator_delete((void *)local_98,local_88._0_8_ + 1);
  }
  if (pTVar5->type_ == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_70._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_70);
    local_70._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_70.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_70.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_70.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"probs");
  if (this_01->_oneof_case_[0] != 0xd2) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0xd2;
    this_02 = (UpsampleLayerParams *)operator_new(0x48);
    CoreML::Specification::UpsampleLayerParams::UpsampleLayerParams(this_02);
    (this_01->layer_).upsample_ = this_02;
  }
  pPVar2 = (this_01->layer_).pooling_;
  iVar1 = (pPVar2->kernelsize_).total_size_;
  if ((pPVar2->kernelsize_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar2->kernelsize_,iVar1 + 1);
  }
  iVar1 = (pPVar2->kernelsize_).current_size_;
  iVar10 = iVar1 + 1;
  (pPVar2->kernelsize_).current_size_ = iVar10;
  ((pPVar2->kernelsize_).rep_)->elements[iVar1] = 1;
  iVar1 = (pPVar2->kernelsize_).total_size_;
  if (iVar10 == iVar1) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pPVar2->kernelsize_,iVar1 + 1);
  }
  iVar1 = (pPVar2->kernelsize_).current_size_;
  (pPVar2->kernelsize_).current_size_ = iVar1 + 1;
  ((pPVar2->kernelsize_).rep_)->elements[iVar1] = 1;
  pPVar2->type_ = 1;
  pPVar2->avgpoolexcludepadding_ = true;
  pPVar2->globalpooling_ = false;
  *(undefined2 *)&pPVar2->field_0x42 = 0;
  CoreML::validate<(MLModelType)500>((Result *)local_98,&local_70);
  bVar3 = CoreML::Result::good((Result *)local_98);
  if (bVar3) {
    pPVar2->avgpoolexcludepadding_ = true;
    pPVar2->globalpooling_ = false;
    *(undefined2 *)&pPVar2->field_0x42 = 0;
    CoreML::validate<(MLModelType)500>((Result *)local_40,&local_70);
    local_98 = local_40;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
    bVar3 = CoreML::Result::good((Result *)local_98);
    if (bVar3) {
      CoreML::Model::Model((Model *)local_40,&local_70);
      pMVar8 = CoreML::Model::getProto((Model *)local_40);
      bVar3 = pMVar8->specificationversion_ != 5;
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc6d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14"
                   ,0x50);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      uVar11 = (uint)bVar3;
      CoreML::Model::~Model((Model *)local_40);
      goto LAB_00186921;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc69);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xc64);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  uVar11 = 1;
  std::ostream::flush();
LAB_00186921:
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_70);
  return uVar11;
}

Assistant:

int testValidUpsampleAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);
    params->add_scalingfactor(1.0);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode_BILINEAR);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
    
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Check that the new field sets spec version to ios 14
    Model mlmodel = Model(m1);
    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14);
    return 0;
}